

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardView.cpp
# Opt level: O0

void __thiscall BoardView::CenterZoomSearchResults(BoardView *this)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  Point *pPVar4;
  BoardView *in_RDI;
  float x;
  float y;
  float sy;
  float sx;
  float dy;
  float dx;
  Point *p_1;
  shared_ptr<Pin> *pn;
  iterator __end2;
  iterator __begin2;
  SharedVector<Pin> *__range2;
  shared_ptr<Component> *pp_1;
  iterator __end1_1;
  iterator __begin1_1;
  SharedVector<Component> *__range1_1;
  Point *p;
  shared_ptr<Pin> *pp;
  iterator __end1;
  iterator __begin1;
  SharedVector<Pin> *__range1;
  int i;
  ImVec2 max;
  ImVec2 min;
  ImVec2 view;
  vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
  *in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  float fVar5;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_80;
  SharedVector<Pin> *local_78;
  reference local_70;
  shared_ptr<Component> *local_68;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  local_60;
  SharedVector<Component> *local_58;
  Point *local_50;
  reference local_48;
  shared_ptr<Pin> *local_40;
  __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
  local_38;
  SharedVector<Pin> *local_30;
  uint local_24;
  ImVec2 local_20;
  ImVec2 local_18;
  ImVec2 local_10;
  
  local_10 = in_RDI->m_board_surface;
  ImVec2::ImVec2(&local_18);
  ImVec2::ImVec2(&local_20);
  local_24 = 0;
  if (((in_RDI->config).showPins & 1U) == 0) {
    (in_RDI->config).showPins = true;
  }
  if (((in_RDI->config).centerZoomSearchResults & 1U) != 0) {
    local_18.y = 3.4028235e+38;
    local_18.x = 3.4028235e+38;
    local_20.y = 1.1754944e-38;
    local_20.x = 1.1754944e-38;
    local_30 = &in_RDI->m_pinHighlighted;
    local_38._M_current =
         (shared_ptr<Pin> *)
         std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                   ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                    in_stack_ffffffffffffff38);
    local_40 = (shared_ptr<Pin> *)
               std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                         ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                          in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                 ::operator*(&local_38);
      peVar3 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                         ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                          0x124b6e);
      local_50 = &peVar3->position;
      if (local_50->x < local_18.x) {
        local_18.x = local_50->x;
      }
      if ((peVar3->position).y < local_18.y) {
        local_18.y = (peVar3->position).y;
      }
      if (local_20.x < local_50->x) {
        local_20.x = local_50->x;
      }
      if (local_20.y < (peVar3->position).y) {
        local_20.y = (peVar3->position).y;
      }
      local_24 = local_24 + 1;
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
      ::operator++(&local_38);
    }
    local_58 = &in_RDI->m_partHighlighted;
    local_60._M_current =
         (shared_ptr<Component> *)
         std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::
         begin(in_stack_ffffffffffffff38);
    local_68 = (shared_ptr<Component> *)
               std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
               ::end(in_stack_ffffffffffffff38);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                              (__normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                               *)in_stack_ffffffffffffff38), bVar1) {
      local_70 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
                 ::operator*(&local_60);
      peVar2 = std::__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x124c99);
      local_78 = &peVar2->pins;
      local_80._M_current =
           (shared_ptr<Pin> *)
           std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::begin
                     ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                      in_stack_ffffffffffffff38);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::end
                ((vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_> *)
                 in_stack_ffffffffffffff38);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                 *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                (__normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
                                 *)in_stack_ffffffffffffff38), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
        ::operator*(&local_80);
        peVar3 = std::__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                           ((__shared_ptr_access<Pin,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                            0x124cf1);
        pPVar4 = &peVar3->position;
        if (pPVar4->x < local_18.x) {
          local_18.x = pPVar4->x;
        }
        if ((peVar3->position).y < local_18.y) {
          local_18.y = (peVar3->position).y;
        }
        if (local_20.x < pPVar4->x) {
          local_20.x = pPVar4->x;
        }
        if (local_20.y < (peVar3->position).y) {
          local_20.y = (peVar3->position).y;
        }
        local_24 = local_24 + 1;
        __gnu_cxx::
        __normal_iterator<std::shared_ptr<Pin>_*,_std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>_>
        ::operator++(&local_80);
      }
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
      ::operator++(&local_60);
    }
    if (((((local_18.x != 3.4028235e+38) || (NAN(local_18.x))) &&
         ((local_18.y != 3.4028235e+38 || (NAN(local_18.y))))) &&
        ((local_20.x != 1.1754944e-38 || (NAN(local_20.x))))) &&
       ((local_20.y != 1.1754944e-38 || (NAN(local_20.y))))) {
      if ((in_RDI->debug & 1U) != 0) {
        fprintf(_stderr,"CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n",
                (double)local_18.x,(double)local_18.y,(double)local_20.x,(double)local_20.y,
                (ulong)local_24);
      }
      if (local_20.x - local_18.x <= 0.0) {
        x = 3.4028235e+38;
      }
      else {
        x = local_10.x / (local_20.x - local_18.x);
      }
      if (local_20.y - local_18.y <= 0.0) {
        y = 3.4028235e+38;
      }
      else {
        y = local_10.y / (local_20.y - local_18.y);
      }
      fVar5 = y;
      if (x < y) {
        fVar5 = x;
      }
      in_RDI->m_scale = fVar5;
      if ((in_RDI->m_scale == 3.4028235e+38) && (!NAN(in_RDI->m_scale))) {
        in_RDI->m_scale = in_RDI->m_scale_floor;
      }
      in_RDI->m_scale = in_RDI->m_scale / (in_RDI->config).partZoomScaleOutFactor;
      if (in_RDI->m_scale < in_RDI->m_scale_floor) {
        in_RDI->m_scale = in_RDI->m_scale_floor;
      }
      in_RDI->m_dx = (local_20.x - local_18.x) / 2.0 + local_18.x;
      in_RDI->m_dy = (local_20.y - local_18.y) / 2.0 + local_18.y;
      SetTarget(in_RDI,x,y);
      in_RDI->m_needsRedraw = true;
    }
  }
  return;
}

Assistant:

void BoardView::CenterZoomSearchResults(void) {
	// ImVec2 view = ImGui::GetIO().DisplaySize;
	ImVec2 view = m_board_surface;
	ImVec2 min, max;
	int i = 0;

	if (!config.showPins) config.showPins = true; // Louis Rossmann UI failure fix.

	if (!config.centerZoomSearchResults) return;

	min.x = min.y = FLT_MAX;
	max.x = max.y = FLT_MIN;

	for (auto &pp : m_pinHighlighted) {
		auto &p = pp->position;
		if (p.x < min.x) min.x = p.x;
		if (p.y < min.y) min.y = p.y;
		if (p.x > max.x) max.x = p.x;
		if (p.y > max.y) max.y = p.y;
		i++;
	}

	for (auto &pp : m_partHighlighted) {
		for (auto &pn : pp->pins) {
			auto &p = pn->position;
			if (p.x < min.x) min.x = p.x;
			if (p.y < min.y) min.y = p.y;
			if (p.x > max.x) max.x = p.x;
			if (p.y > max.y) max.y = p.y;
			i++;
		}
	}

	// Bounds check!
	if ((min.x == FLT_MAX) || (min.y == FLT_MAX) || (max.x == FLT_MIN) || (max.y == FLT_MIN)) return;

	if (debug) fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);
	// fprintf(stderr, "CenterzoomSearchResults: bbox[%d]: %0.1f %0.1f - %0.1f %0.1f\n", i, min.x, min.y, max.x, max.y);

	float dx = (max.x - min.x);
	float dy = (max.y - min.y);
	float sx = dx > 0 ? view.x / dx : FLT_MAX;
	float sy = dy > 0 ? view.y / dy : FLT_MAX;

	m_scale = sx < sy ? sx : sy;
	if (m_scale == FLT_MAX) m_scale = m_scale_floor;
	m_scale /= config.partZoomScaleOutFactor;
	if (m_scale < m_scale_floor) m_scale = m_scale_floor;

	m_dx = (max.x - min.x) / 2 + min.x;
	m_dy = (max.y - min.y) / 2 + min.y;
	SetTarget(m_dx, m_dy);
	m_needsRedraw = true;
}